

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O1

bool __thiscall ktxValidator::processOption(ktxValidator *this,argparser *parser,int opt)

{
  int iVar1;
  
  if (opt == 0x6d) {
    iVar1 = atoi((parser->optarg)._M_dataplus._M_p);
    *(int *)&(this->options).super_commandOptions.field_0x44 = iVar1;
  }
  else if (opt == 0x77) {
    (this->options).errorOnWarning = true;
  }
  else {
    if (opt != 0x71) {
      return false;
    }
    (this->options).quiet = true;
  }
  return true;
}

Assistant:

bool
ktxValidator::processOption(argparser& parser, int opt)
{
    switch (opt) {
      case 'q':
        options.quiet = true;
        break;
      case 'm':
        options.maxIssues = atoi(parser.optarg.c_str());
        break;
      case 'w':
        options.errorOnWarning = true;
        break;
      default:
        return false;
    }
    return true;
}